

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O0

void updateZBuffer(int x,int y,Vec3f *points,Vec2f *text,Vec3f *norms,Vec3f *barycenter,
                  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *framebuffer,
                  vector<float,_std::allocator<float>_> *zBuffer)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  TGAColor TVar5;
  Vec3<float> *v;
  reference pvVar6;
  reference this;
  float fVar7;
  Vec3<float> local_9c;
  uchar local_8d [4];
  uchar local_89;
  float fStack_88;
  TGAColor textureForThePoint;
  float yText;
  float xText;
  float illuminate;
  Vec3<float> local_70;
  Vec3<float> local_64;
  Vec3<float> local_58;
  Vec3<float> local_4c;
  undefined1 local_40 [8];
  Vec3f interNorm;
  float z;
  Vec3f *barycenter_local;
  Vec3f *norms_local;
  Vec2f *text_local;
  Vec3f *points_local;
  int y_local;
  int x_local;
  
  interNorm.y = points[2].z * barycenter->z +
                points->z * barycenter->x + points[1].z * barycenter->y;
  unique0x10000271 = barycenter;
  Vec3<float>::operator*(&local_64,barycenter->x);
  Vec3<float>::operator*(&local_70,stack0xffffffffffffffd0->y);
  Vec3<float>::operator+(&local_58,&local_64);
  Vec3<float>::operator*((Vec3<float> *)&xText,stack0xffffffffffffffd0->z);
  Vec3<float>::operator+(&local_4c,&local_58);
  v = Vec3<float>::normalize(&local_4c,1.0);
  Vec3<float>::Vec3((Vec3<float> *)local_40,v);
  fVar7 = Vec3<float>::operator*((Vec3<float> *)local_40,&lamp);
  textureForThePoint._1_4_ =
       text[2].x * stack0xffffffffffffffd0->z +
       text->x * stack0xffffffffffffffd0->x + text[1].x * stack0xffffffffffffffd0->y;
  fStack_88 = text[2].y * stack0xffffffffffffffd0->z +
              text->y * stack0xffffffffffffffd0->x + text[1].y * stack0xffffffffffffffd0->y;
  iVar4 = TGAImage::get_width(&texture);
  uVar1 = fStack_88;
  textureForThePoint._1_4_ = (float)textureForThePoint._1_4_ * (float)iVar4;
  iVar4 = TGAImage::get_height(&texture);
  fStack_88 = (float)uVar1 * (float)iVar4;
  TVar5 = TGAImage::get(&texture,(int)(float)textureForThePoint._1_4_,(int)fStack_88);
  fVar2 = interNorm.y;
  local_8d = TVar5.bgra;
  local_89 = TVar5.bytespp;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](zBuffer,(long)(y * 0x800 + x));
  fVar3 = interNorm.y;
  if (*pvVar6 <= fVar2) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](zBuffer,(long)(y * 0x800 + x));
    *pvVar6 = fVar3;
    Vec3<float>::Vec3(&local_9c,((float)((uint)local_8d >> 0x10 & 0xff) / 255.0) * fVar7,
                      ((float)((uint)local_8d >> 8 & 0xff) / 255.0) * fVar7,
                      ((float)((uint)local_8d & 0xff) / 255.0) * fVar7);
    this = std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::operator[]
                     (framebuffer,(long)((0x5ff - y) * 0x800 + x));
    Vec3<float>::operator=(this,&local_9c);
  }
  return;
}

Assistant:

void updateZBuffer(int x, int y, Vec3f points[], Vec2f text[], const Vec3f norms[], const Vec3f &barycenter,
                   std::vector<Vec3f> &framebuffer, std::vector<float> &zBuffer) {
    // bi-linear interpolation to retrieve Z
    float z = points[0].z * barycenter.x + points[1].z * barycenter.y + points[2].z * barycenter.z;

    // getting norm of the current point using bi-linear interpolation between norms of vertices
    Vec3f interNorm = (norms[0] * barycenter.x + norms[1] * barycenter.y + norms[2] * barycenter.z).normalize();
    float illuminate = interNorm*lamp;

    // retrieve position in the texture

    float xText, yText;
    xText = text[0].x * barycenter.x + text[1].x * barycenter.y + text[2].x * barycenter.z;
    yText = text[0].y * barycenter.x + text[1].y * barycenter.y + text[2].y * barycenter.z;
    xText *= (float)(texture.get_width());
    yText = (yText) * (float)(texture.get_height());
    TGAColor textureForThePoint = texture.get((int)xText, (int)(yText));

    //    std::cout << (int) textureForThePoint.bgra[2] << std::endl;
    //    std::cout << (int) textureForThePoint.bgra[1] << std::endl;
    //    std::cout << (int) textureForThePoint.bgra[0] << std::endl;
//        std::cout << illuminate << std::endl;

    // checking z-buffer
    if(z >= zBuffer[y*width + x]){
        zBuffer[y*width + x] = z;
        framebuffer[(height - 1 - y)*width + x] = Vec3f(
                ((float)textureForThePoint.bgra[2]/255)*illuminate,
                ((float)textureForThePoint.bgra[1]/255)*illuminate,
                ((float)textureForThePoint.bgra[0]/255)*illuminate
                );
    }
}